

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Poly1305.c
# Opt level: O3

void EverCrypt_Poly1305_mac(uint8_t *output,uint8_t *input,uint32_t input_len,uint8_t *key)

{
  _Bool _Var1;
  _Bool _Var2;
  ulong __n;
  uint8_t tmp [16];
  uint8_t ctx [192];
  uint8_t local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  
  _Var1 = EverCrypt_AutoConfig2_has_vec256();
  _Var2 = EverCrypt_AutoConfig2_has_vec128();
  if (_Var1) {
    Hacl_MAC_Poly1305_Simd256_mac(output,input,input_len,key);
    return;
  }
  if (_Var2) {
    Hacl_MAC_Poly1305_Simd128_mac(output,input,input_len,key);
    return;
  }
  memset(&local_f8,0,0xc0);
  local_e0 = *(undefined8 *)key;
  uStack_d8 = *(undefined8 *)(key + 8);
  local_d0 = *(undefined4 *)(key + 0x10);
  uStack_cc = *(undefined4 *)(key + 0x14);
  uStack_c8 = *(undefined4 *)(key + 0x18);
  uStack_c4 = *(undefined4 *)(key + 0x1c);
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '\0';
  local_108[0xb] = '\0';
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  if ((input_len & 0xf) == 0) {
    __n = (ulong)input_len;
  }
  else {
    __n = (ulong)(input_len & 0xf);
    memcpy(local_108,input + (input_len & 0xfffffff0),__n);
    x64_poly1305(&local_f8,input,(ulong)(input_len & 0xfffffff0),0);
    local_e0 = *(undefined8 *)key;
    uStack_d8 = *(undefined8 *)(key + 8);
    local_d0 = *(undefined4 *)(key + 0x10);
    uStack_cc = *(undefined4 *)(key + 0x14);
    uStack_c8 = *(undefined4 *)(key + 0x18);
    uStack_c4 = *(undefined4 *)(key + 0x1c);
    input = local_108;
  }
  x64_poly1305(&local_f8,input,__n,1);
  *(undefined8 *)output = local_f8;
  *(undefined8 *)(output + 8) = uStack_f0;
  return;
}

Assistant:

void EverCrypt_Poly1305_mac(uint8_t *output, uint8_t *input, uint32_t input_len, uint8_t *key)
{
  bool vec256 = EverCrypt_AutoConfig2_has_vec256();
  bool vec128 = EverCrypt_AutoConfig2_has_vec128();
  #if HACL_CAN_COMPILE_VEC256
  if (vec256)
  {
    KRML_MAYBE_UNUSED_VAR(vec128);
    Hacl_MAC_Poly1305_Simd256_mac(output, input, input_len, key);
    return;
  }
  #endif
  #if HACL_CAN_COMPILE_VEC128
  if (vec128)
  {
    KRML_MAYBE_UNUSED_VAR(vec256);
    Hacl_MAC_Poly1305_Simd128_mac(output, input, input_len, key);
    return;
  }
  #endif
  KRML_MAYBE_UNUSED_VAR(vec256);
  KRML_MAYBE_UNUSED_VAR(vec128);
  #if HACL_CAN_COMPILE_VALE
  poly1305_vale(output, input, input_len, key);
  #else
  KRML_HOST_IGNORE(poly1305_vale);
  Hacl_MAC_Poly1305_mac(output, input, input_len, key);
  #endif
}